

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

bool __thiscall
TFileNameDatabase::CompareAndCopyPathFragmentByIndex
          (TFileNameDatabase *this,TMndxSearch *pSearch,DWORD TableIndex)

{
  byte NewItem;
  TStruct40 *pTVar1;
  _HASH_ENTRY *p_Var2;
  bool bVar3;
  uint uVar4;
  DWORD DVar5;
  char *__function;
  
  pTVar1 = pSearch->pStruct40;
  do {
    uVar4 = this->HashTableMask & TableIndex;
    if ((this->HashTable).ItemCount <= uVar4) {
      __function = "T &TGenericArray<_HASH_ENTRY>::operator[](size_t) [T = _HASH_ENTRY]";
LAB_00117863:
      __assert_fail("index < ItemCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                    ,0x1d0,__function);
    }
    p_Var2 = (this->HashTable).ItemArray;
    if (TableIndex == p_Var2[uVar4].NextIndex) {
      p_Var2 = p_Var2 + uVar4;
      uVar4 = (p_Var2->field_2).FragmentOffset;
      if (uVar4 >> 8 < 0xffffff) {
        if (this->pChildDB == (TFileNameDatabase *)0x0) {
          bVar3 = TPathFragmentTable::CompareAndCopyPathFragment
                            (&this->PathFragmentTable,pSearch,(ulong)uVar4);
        }
        else {
          bVar3 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,uVar4);
        }
        if (bVar3 == false) {
          return false;
        }
      }
      else {
        if ((p_Var2->field_2).SingleChar != pSearch->szSearchMask[pTVar1->PathLength]) {
          return false;
        }
        TGenericArray<char>::Insert(&pTVar1->PathBuffer,(p_Var2->field_2).SingleChar);
        pTVar1->PathLength = pTVar1->PathLength + 1;
      }
      TableIndex = p_Var2->NodeIndex;
      if (TableIndex == 0) {
        return true;
      }
    }
    else {
      bVar3 = TSparseArray::IsItemPresent(&this->CollisionHiBitsIndexes,(ulong)TableIndex);
      if (bVar3) {
        DVar5 = GetPathFragmentOffset1(this,TableIndex);
        if (this->pChildDB == (TFileNameDatabase *)0x0) {
          bVar3 = TPathFragmentTable::CompareAndCopyPathFragment
                            (&this->PathFragmentTable,pSearch,(ulong)DVar5);
        }
        else {
          bVar3 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,DVar5);
        }
        if (bVar3 == false) {
          return false;
        }
      }
      else {
        if ((this->LoBitsTable).ItemCount <= TableIndex) {
          __function = "T &TGenericArray<unsigned char>::operator[](size_t) [T = unsigned char]";
          goto LAB_00117863;
        }
        NewItem = (this->LoBitsTable).ItemArray[TableIndex];
        if ((uint)NewItem != (int)pSearch->szSearchMask[pTVar1->PathLength]) {
          return false;
        }
        TGenericArray<char>::Insert(&pTVar1->PathBuffer,NewItem);
        pTVar1->PathLength = pTVar1->PathLength + 1;
      }
      if (TableIndex <= this->field_214) {
        return true;
      }
      DVar5 = TSparseArray::GetItem1(&this->CollisionTable,TableIndex);
      TableIndex = DVar5 + ~TableIndex;
    }
    if (pSearch->cchSearchMask <= (ulong)pTVar1->PathLength) {
      CopyPathFragmentByIndex(this,pSearch,TableIndex);
      return true;
    }
  } while( true );
}

Assistant:

bool CompareAndCopyPathFragmentByIndex(TMndxSearch * pSearch, DWORD TableIndex)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;
        PHASH_ENTRY pHashEntry;

        // HOTS: 1959024
        for(;;)
        {
            pHashEntry = &HashTable[TableIndex & HashTableMask];
            if(TableIndex == pHashEntry->NextIndex)
            {
                // HOTS: 1959047
                if(!IsPathFragmentSingleChar(pHashEntry))
                {
                    // HOTS: 195905A
                    if(pChildDB != NULL)
                    {
                        if(!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, pHashEntry->ChildTableIndex))
                            return false;
                    }
                    else
                    {
                        if(!PathFragmentTable.CompareAndCopyPathFragment(pSearch, pHashEntry->FragmentOffset))
                            return false;
                    }
                }
                else
                {
                    // HOTS: 1959092
                    if(pHashEntry->SingleChar != pSearch->szSearchMask[pStruct40->PathLength])
                        return false;

                    // Insert the low 8 bits to the path being built
                    pStruct40->PathBuffer.Insert(pHashEntry->SingleChar);
                    pStruct40->PathLength++;
                }

                // HOTS: 195912E
                TableIndex = pHashEntry->NodeIndex;
                if(TableIndex == 0)
                    return true;
            }
            else
            {
                // HOTS: 1959147
                if(IsPathFragmentString(TableIndex))
                {
                    // HOTS: 195917C
                    DWORD FragmentOffset = GetPathFragmentOffset1(TableIndex);

                    if(pChildDB != NULL)
                    {
                        if(!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, FragmentOffset))
                            return false;
                    }
                    else
                    {
                        if(!PathFragmentTable.CompareAndCopyPathFragment(pSearch, FragmentOffset))
                            return false;
                    }
                }
                else
                {
                    // HOTS: 195920E
                    if(LoBitsTable[TableIndex] != pSearch->szSearchMask[pStruct40->PathLength])
                        return false;

                    // Insert one character to the path being built
                    pStruct40->PathBuffer.Insert(LoBitsTable[TableIndex]);
                    pStruct40->PathLength++;
                }

                // HOTS: 19592B6
                if(TableIndex <= field_214)
                    return true;

                TableIndex = 0xFFFFFFFF - TableIndex + CollisionTable.GetItem1(TableIndex);
            }

            // HOTS: 19592D5
            if(pStruct40->PathLength >= pSearch->cchSearchMask)
                break;
        }

        CopyPathFragmentByIndex(pSearch, TableIndex);
        return true;
    }